

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  size_t size;
  void *prealloc;
  secp256k1_context *psVar1;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0xa7,"test condition failed: ctx != NULL");
    abort();
  }
  if ((ctx->ecmult_gen_ctx).built != 0) {
    size = secp256k1_context_preallocated_clone_size(ctx);
    prealloc = checked_malloc(&ctx->error_callback,size);
    psVar1 = secp256k1_context_preallocated_clone(ctx,prealloc);
    return psVar1;
  }
  (*(ctx->illegal_callback).fn)("secp256k1_context_is_proper(ctx)",(ctx->illegal_callback).data);
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}